

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

int Ivy_FraigSetActivityFactors(Ivy_FraigMan_t *p,Ivy_Obj_t *pOld,Ivy_Obj_t *pNew)

{
  double dVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  uint LevelMax;
  int LevelMin;
  
  if (pOld == (Ivy_Obj_t *)0x0 && pNew == (Ivy_Obj_t *)0x0) {
    __assert_fail("pOld || pNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0xa50,
                  "int Ivy_FraigSetActivityFactors(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  aVar3 = Abc_Clock();
  if ((p->pSat->act_vars).size < 0) {
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (p->pSat->act_vars).size = 0;
  Ivy_ManIncrementTravId(p->pManFraig);
  dVar1 = p->pParams->dActConeRatio;
  if ((0.0 < dVar1) && (dVar1 < 1.0)) {
    if (pNew == (Ivy_Obj_t *)0x0) {
      if (pOld == (Ivy_Obj_t *)0x0) {
        LevelMax = 0;
      }
      else {
        LevelMax = *(uint *)&pOld->field_0x8 >> 0xb;
      }
    }
    else {
      LevelMax = *(uint *)&pNew->field_0x8 >> 0xb;
      if ((pOld != (Ivy_Obj_t *)0x0) &&
         (uVar2 = *(uint *)&pOld->field_0x8 >> 0xb, LevelMax <= uVar2)) {
        LevelMax = uVar2;
      }
    }
    LevelMin = (int)((1.0 - dVar1) * (double)LevelMax);
    if ((pOld != (Ivy_Obj_t *)0x0) && (pOld->Id != 0)) {
      Ivy_FraigSetActivityFactors_rec(p,pOld,LevelMin,LevelMax);
    }
    if ((pNew != (Ivy_Obj_t *)0x0) && (pNew->Id != 0)) {
      Ivy_FraigSetActivityFactors_rec(p,pNew,LevelMin,LevelMax);
    }
    aVar4 = Abc_Clock();
    p->timeTrav = p->timeTrav + (aVar4 - aVar3);
    return (int)(aVar4 - aVar3);
  }
  __assert_fail("p->pParams->dActConeRatio > 0 && p->pParams->dActConeRatio < 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0xa57,"int Ivy_FraigSetActivityFactors(Ivy_FraigMan_t *, Ivy_Obj_t *, Ivy_Obj_t *)"
               );
}

Assistant:

int Ivy_FraigSetActivityFactors( Ivy_FraigMan_t * p, Ivy_Obj_t * pOld, Ivy_Obj_t * pNew )
{
    int LevelMin, LevelMax;
    abctime clk;
    assert( pOld || pNew );
clk = Abc_Clock(); 
    // reset the active variables
    veci_resize(&p->pSat->act_vars, 0);
    // prepare for traversal
    Ivy_ManIncrementTravId( p->pManFraig );
    // determine the min and max level to visit
    assert( p->pParams->dActConeRatio > 0 && p->pParams->dActConeRatio < 1 );
    LevelMax = IVY_MAX( (pNew ? pNew->Level : 0), (pOld ? pOld->Level : 0) );
    LevelMin = (int)(LevelMax * (1.0 - p->pParams->dActConeRatio));
    // traverse
    if ( pOld && !Ivy_ObjIsConst1(pOld) )
        Ivy_FraigSetActivityFactors_rec( p, pOld, LevelMin, LevelMax );
    if ( pNew && !Ivy_ObjIsConst1(pNew) )
        Ivy_FraigSetActivityFactors_rec( p, pNew, LevelMin, LevelMax );
//Ivy_FraigPrintActivity( p );
p->timeTrav += Abc_Clock() - clk;
    return 1;
}